

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O3

int main(void)

{
  TimeStamp *pTVar1;
  ostream *poVar2;
  int iVar3;
  Bundle pduBundle;
  Connection myConnection;
  Bundle local_2b8;
  KRef_Ptr<KDIS::PDU::Header7> local_278;
  Entity_State_PDU local_260;
  KDataStream local_110;
  Connection local_e8;
  
  pTVar1 = &local_260.super_Header.super_Header6.m_TimeStamp;
  local_260.super_Header.super_Header6._vptr_Header6 = (_func_int **)pTVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"192.168.3.255","");
  KDIS::NETWORK::Connection::Connection
            (&local_e8,(KString *)&local_260,3000,false,true,(PDU_Factory *)0x0,false);
  if ((TimeStamp *)local_260.super_Header.super_Header6._vptr_Header6 != pTVar1) {
    operator_delete(local_260.super_Header.super_Header6._vptr_Header6,
                    (long)local_260.super_Header.super_Header6.m_TimeStamp.super_DataTypeBase.
                          _vptr_DataTypeBase + 1);
  }
  KDIS::PDU::Bundle::Bundle(&local_2b8);
  iVar3 = 10;
  do {
    EntityGenerator::GenerateEntity();
    KDIS::PDU::Entity_State_PDU::Encode(&local_110,&local_260);
    KDIS::PDU::Bundle::AddPDU(&local_2b8,&local_110);
    KDIS::KDataStream::~KDataStream(&local_110);
    KDIS::PDU::Entity_State_PDU::~Entity_State_PDU(&local_260);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  KDIS::PDU::Bundle::Encode((KDataStream *)&local_260,&local_2b8);
  KDIS::NETWORK::Connection::Send(&local_e8,(KDataStream *)&local_260);
  KDIS::KDataStream::~KDataStream((KDataStream *)&local_260);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"1: Sent Bundle, Size: ",0x16);
  KDIS::PDU::Bundle::GetLength(&local_2b8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  KDIS::PDU::Bundle::ClearPDUs(&local_2b8);
  iVar3 = 10;
  do {
    EntityGenerator::GenerateEntityRef();
    KDIS::PDU::Bundle::AddPDU(&local_2b8,&local_278);
    local_278._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00223b00;
    KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>::unRef(&local_278);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  KDIS::PDU::Bundle::Encode((KDataStream *)&local_260,&local_2b8);
  KDIS::NETWORK::Connection::Send(&local_e8,(KDataStream *)&local_260);
  KDIS::KDataStream::~KDataStream((KDataStream *)&local_260);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"2: Sent Bundle, Size: ",0x16);
  KDIS::PDU::Bundle::GetLength(&local_2b8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  KDIS::PDU::Bundle::~Bundle(&local_2b8);
  KDIS::NETWORK::Connection::~Connection(&local_e8);
  return 0;
}

Assistant:

int main()
{
    try
    {
        // Note: This address will probably be different for your network.
        Connection myConnection( "192.168.3.255" );

        // We have 2 ways we can use the Bundle.

        //
        // 1
        // We can give it PDU data streams and it will concatenate them for us into a single packet.

        // Create the bundle. Just a collection of random ESPDUs.
        Bundle pduBundle;
        for( int i = 0; i < PDU_COUNT; ++i )
        {
            pduBundle.AddPDU( EntityGenerator::GenerateEntity().Encode() );
        }

        // Now send the bundle
        myConnection.Send( pduBundle.Encode() );
        cout << "1: Sent Bundle, Size: " << pduBundle.GetLength() << endl;

        //
        // 2
        // We can give it PDU pointers/references which will be encoded each time.
        // We can then use this over time if we want to keep sending the PDU together.
        pduBundle.ClearPDUs();

        for( int i = 0; i < PDU_COUNT; ++i )
        {
            pduBundle.AddPDU( EntityGenerator::GenerateEntityRef() );
        }

        // Now send the bundle
        myConnection.Send( pduBundle.Encode() );

        cout << "2: Sent Bundle, Size: " << pduBundle.GetLength() << endl;
    }
    catch( exception & e )
    {
        cout << e.what() << endl;
    }

    return 0;
}